

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

void __thiscall testing::UnitTest::PopGTestTrace(UnitTest *this)

{
  pointer pTVar1;
  pointer pcVar2;
  vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_> *pvVar3;
  
  internal::MutexBase::Lock(&(this->mutex_).super_MutexBase);
  pvVar3 = internal::
           ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
           ::GetOrCreateValue(&this->impl_->gtest_trace_stack_);
  pTVar1 = (pvVar3->
           super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (pvVar3->
  super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>).
  _M_impl.super__Vector_impl_data._M_finish = pTVar1 + -1;
  pcVar2 = pTVar1[-1].message._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &pTVar1[-1].message.field_2) {
    operator_delete(pcVar2);
  }
  internal::MutexBase::Unlock(&(this->mutex_).super_MutexBase);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  internal::MutexLock lock(&mutex_);
  impl_->gtest_trace_stack().pop_back();
}